

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ecdsa_adaptor_adapt
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *adaptor_secret32,
              uchar *adaptor_sig65)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar34;
  uint uVar35;
  ulong uVar36;
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  uint uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  int overflow;
  secp256k1_scalar sigr;
  uint64_t l [8];
  int local_fc;
  secp256k1_scalar local_f8;
  secp256k1_scalar local_d8;
  secp256k1_scalar local_b8;
  secp256k1_scalar local_98;
  uint64_t local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  undefined1 local_48 [16];
  
  if (sig == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_ecdsa_adaptor_adapt_cold_3();
  }
  else if (adaptor_secret32 == (uchar *)0x0) {
    secp256k1_ecdsa_adaptor_adapt_cold_2();
  }
  else {
    if (adaptor_sig65 != (uchar *)0x0) {
      secp256k1_scalar_set_b32(&local_b8,adaptor_secret32,&local_fc);
      if (local_fc != 0) {
        return 0;
      }
      iVar34 = secp256k1_ecdsa_adaptor_sig_deserialize
                         ((secp256k1_ge *)0x0,&local_f8,&local_98,adaptor_sig65);
      if (iVar34 == 0) {
        return 0;
      }
      secp256k1_scalar_inverse(&local_d8,&local_b8);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_d8.d[0];
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_98.d[0];
      uVar38 = SUB168(auVar1 * auVar17,8);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = uVar38;
      local_78 = SUB168(auVar1 * auVar17,0);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_d8.d[0];
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_98.d[1];
      auVar2 = auVar2 * auVar18;
      uVar44 = SUB168(auVar2 + auVar33,0);
      uVar49 = SUB168(auVar2 + auVar33,8);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_d8.d[1];
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_98.d[0];
      uVar39 = SUB168(auVar3 * auVar19,8);
      uVar36 = SUB168(auVar3 * auVar19,0);
      local_70 = uVar44 + uVar36;
      uVar36 = (ulong)CARRY8(uVar44,uVar36);
      uVar44 = uVar49 + uVar39;
      uVar50 = uVar44 + uVar36;
      uVar51 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar38,auVar2._0_8_)) +
               (ulong)(CARRY8(uVar49,uVar39) || CARRY8(uVar44,uVar36));
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_d8.d[0];
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_98.d[2];
      uVar40 = SUB168(auVar4 * auVar20,8);
      uVar36 = SUB168(auVar4 * auVar20,0);
      uVar38 = uVar50 + uVar36;
      uVar36 = (ulong)CARRY8(uVar50,uVar36);
      uVar39 = uVar51 + uVar40;
      uVar52 = uVar39 + uVar36;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_d8.d[1];
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_98.d[1];
      uVar41 = SUB168(auVar5 * auVar21,8);
      uVar44 = SUB168(auVar5 * auVar21,0);
      uVar50 = uVar38 + uVar44;
      uVar44 = (ulong)CARRY8(uVar38,uVar44);
      uVar49 = uVar52 + uVar41;
      uVar53 = uVar49 + uVar44;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_d8.d[2];
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_98.d[0];
      uVar42 = SUB168(auVar6 * auVar22,8);
      uVar38 = SUB168(auVar6 * auVar22,0);
      local_68 = uVar50 + uVar38;
      uVar38 = (ulong)CARRY8(uVar50,uVar38);
      uVar50 = uVar53 + uVar42;
      uVar54 = uVar50 + uVar38;
      uVar45 = (ulong)(CARRY8(uVar51,uVar40) || CARRY8(uVar39,uVar36)) +
               (ulong)(CARRY8(uVar52,uVar41) || CARRY8(uVar49,uVar44)) +
               (ulong)(CARRY8(uVar53,uVar42) || CARRY8(uVar50,uVar38));
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_d8.d[0];
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_98.d[3];
      uVar42 = SUB168(auVar7 * auVar23,8);
      uVar36 = SUB168(auVar7 * auVar23,0);
      uVar38 = uVar54 + uVar36;
      uVar36 = (ulong)CARRY8(uVar54,uVar36);
      uVar49 = uVar45 + uVar42;
      uVar54 = uVar49 + uVar36;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_d8.d[1];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_98.d[2];
      uVar51 = SUB168(auVar8 * auVar24,8);
      uVar44 = SUB168(auVar8 * auVar24,0);
      uVar39 = uVar38 + uVar44;
      uVar44 = (ulong)CARRY8(uVar38,uVar44);
      uVar50 = uVar54 + uVar51;
      uVar46 = uVar50 + uVar44;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_d8.d[2];
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_98.d[1];
      uVar52 = SUB168(auVar9 * auVar25,8);
      uVar38 = SUB168(auVar9 * auVar25,0);
      uVar41 = uVar39 + uVar38;
      uVar38 = (ulong)CARRY8(uVar39,uVar38);
      uVar40 = uVar46 + uVar52;
      uVar47 = uVar40 + uVar38;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_d8.d[3];
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_98.d[0];
      uVar53 = SUB168(auVar10 * auVar26,8);
      uVar39 = SUB168(auVar10 * auVar26,0);
      local_60 = uVar41 + uVar39;
      uVar39 = (ulong)CARRY8(uVar41,uVar39);
      uVar41 = uVar47 + uVar53;
      uVar48 = uVar41 + uVar39;
      uVar51 = (ulong)(CARRY8(uVar45,uVar42) || CARRY8(uVar49,uVar36)) +
               (ulong)(CARRY8(uVar54,uVar51) || CARRY8(uVar50,uVar44)) +
               (ulong)(CARRY8(uVar46,uVar52) || CARRY8(uVar40,uVar38)) +
               (ulong)(CARRY8(uVar47,uVar53) || CARRY8(uVar41,uVar39));
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_d8.d[1];
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_98.d[3];
      uVar40 = SUB168(auVar11 * auVar27,8);
      uVar36 = SUB168(auVar11 * auVar27,0);
      uVar38 = uVar48 + uVar36;
      uVar36 = (ulong)CARRY8(uVar48,uVar36);
      uVar39 = uVar51 + uVar40;
      uVar52 = uVar39 + uVar36;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_d8.d[2];
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_98.d[2];
      uVar41 = SUB168(auVar12 * auVar28,8);
      uVar44 = SUB168(auVar12 * auVar28,0);
      uVar50 = uVar38 + uVar44;
      uVar44 = (ulong)CARRY8(uVar38,uVar44);
      uVar49 = uVar52 + uVar41;
      uVar53 = uVar49 + uVar44;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_d8.d[3];
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_98.d[1];
      uVar42 = SUB168(auVar13 * auVar29,8);
      uVar38 = SUB168(auVar13 * auVar29,0);
      local_58 = uVar50 + uVar38;
      uVar38 = (ulong)CARRY8(uVar50,uVar38);
      uVar50 = uVar53 + uVar42;
      uVar45 = uVar50 + uVar38;
      uVar40 = (ulong)(CARRY8(uVar51,uVar40) || CARRY8(uVar39,uVar36)) +
               (ulong)(CARRY8(uVar52,uVar41) || CARRY8(uVar49,uVar44)) +
               (ulong)(CARRY8(uVar53,uVar42) || CARRY8(uVar50,uVar38));
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_d8.d[2];
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_98.d[3];
      uVar49 = SUB168(auVar14 * auVar30,8);
      uVar36 = SUB168(auVar14 * auVar30,0);
      uVar39 = uVar45 + uVar36;
      uVar36 = (ulong)CARRY8(uVar45,uVar36);
      uVar38 = uVar40 + uVar49;
      uVar41 = uVar38 + uVar36;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_d8.d[3];
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_98.d[2];
      uVar50 = SUB168(auVar15 * auVar31,8);
      uVar44 = SUB168(auVar15 * auVar31,0);
      local_50 = uVar39 + uVar44;
      uVar44 = (ulong)CARRY8(uVar39,uVar44);
      uVar39 = uVar41 + uVar50;
      local_48._8_8_ =
           (ulong)(CARRY8(uVar40,uVar49) || CARRY8(uVar38,uVar36)) +
           (ulong)(CARRY8(uVar41,uVar50) || CARRY8(uVar39,uVar44));
      local_48._0_8_ = uVar39 + uVar44;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_d8.d[3];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_98.d[3];
      local_48 = auVar16 * auVar32 + local_48;
      secp256k1_scalar_reduce_512(&local_d8,&local_78);
      uVar35 = (uint)(local_d8.d[3] >> 0x3f);
      uVar37 = uVar35 ^ 1;
      uVar43 = uVar37;
      if (local_d8.d[2] == 0xffffffffffffffff) {
        uVar43 = 0;
      }
      if (0x5d576e7357a4501c < local_d8.d[1]) {
        uVar37 = 0;
      }
      uVar37 = (uVar37 | uVar43 | local_d8.d[3] < 0x7fffffffffffffff) ^ 1;
      uVar43 = 0;
      if (0xdfe92f46681b20a0 < local_d8.d[0]) {
        uVar43 = uVar37;
      }
      if (0x5d576e7357a4501d < local_d8.d[1]) {
        uVar43 = uVar37;
      }
      secp256k1_scalar_cond_negate(&local_d8,uVar43 | uVar35);
      *(uint64_t *)sig->data = local_f8.d[0];
      *(uint64_t *)(sig->data + 8) = local_f8.d[1];
      *(uint64_t *)(sig->data + 0x10) = local_f8.d[2];
      *(uint64_t *)(sig->data + 0x18) = local_f8.d[3];
      *(uint64_t *)(sig->data + 0x20) = local_d8.d[0];
      *(uint64_t *)(sig->data + 0x28) = local_d8.d[1];
      *(uint64_t *)(sig->data + 0x30) = local_d8.d[2];
      *(uint64_t *)(sig->data + 0x38) = local_d8.d[3];
      return 1;
    }
    secp256k1_ecdsa_adaptor_adapt_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_adaptor_adapt(const secp256k1_context* ctx, secp256k1_ecdsa_signature *sig, const unsigned char *adaptor_secret32, const unsigned char *adaptor_sig65) {
    secp256k1_scalar adaptor_secret;
    secp256k1_scalar sp;
    secp256k1_scalar s;
    secp256k1_scalar sigr;
    int overflow;
    unsigned char buf32[32];
    int high;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(adaptor_secret32 != NULL);
    ARG_CHECK(adaptor_sig65 != NULL);

    secp256k1_scalar_set_b32(&adaptor_secret, adaptor_secret32, &overflow);
    if (overflow) {
        return 0;
    }

    if (!secp256k1_ecdsa_adaptor_sig_deserialize(NULL, &sigr, &sp, adaptor_sig65)) {
        secp256k1_scalar_clear(&adaptor_secret);
        return 0;
    }
    secp256k1_scalar_inverse(&s, &adaptor_secret);
    secp256k1_scalar_mul(&s, &s, &sp);
    high = secp256k1_scalar_is_high(&s);
    secp256k1_scalar_cond_negate(&s, high);

    secp256k1_ecdsa_signature_save(sig, &sigr, &s);

    memset(buf32, 0, sizeof(buf32));
    secp256k1_scalar_clear(&adaptor_secret);
    secp256k1_scalar_clear(&sp);
    secp256k1_scalar_clear(&s);

    return 1;
}